

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_standard_types.cpp
# Opt level: O0

void __thiscall StringWriter_WriteCharString_Test::TestBody(StringWriter_WriteCharString_Test *this)

{
  bool bVar1;
  char *pcVar2;
  undefined1 *puVar3;
  AssertHelper local_e0;
  Message local_d8;
  size_t local_d0;
  size_type local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_2;
  Message local_a8;
  size_t local_a0;
  size_type local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_1;
  Message local_78;
  undefined1 local_6f;
  uchar local_6e [15];
  char local_5f [7];
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  allocator local_31;
  undefined1 local_30 [8];
  string str;
  StringWriter_WriteCharString_Test *this_local;
  
  str.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,"hello",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pstore::serialize::write<pstore::serialize::archive::vector_writer&,std::__cxx11::string>
            (&(this->super_StringWriter).writer_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  local_6e[5] = 0xb;
  builtin_memcpy(local_6e,"lleh",5);
  local_6f = 0x6f;
  puVar3 = &local_6f;
  testing::
  ElementsAre<unsigned_char,unsigned_char,unsigned_char,unsigned_char,unsigned_char,unsigned_char,unsigned_char>
            (local_6e + 6,local_6e + 5,local_6e + 4,local_6e + 3,local_6e + 2,local_6e + 1,local_6e)
  ;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<unsigned_char,unsigned_char,unsigned_char,unsigned_char,unsigned_char,unsigned_char,unsigned_char>>>
            ((tuple<unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char>
              )SUB87(puVar3,0));
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<unsigned_char,unsigned_char,unsigned_char,unsigned_char,unsigned_char,unsigned_char,unsigned_char>>>
  ::operator()(local_58,local_5f,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)"bytes_");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x38,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  local_98 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       (&(this->super_StringWriter).bytes_);
  local_a0 = pstore::serialize::archive::
             writer_base<pstore::serialize::archive::details::vector_writer_policy>::bytes_consumed
                       (&(this->super_StringWriter).writer_.
                         super_writer_base<pstore::serialize::archive::details::vector_writer_policy>
                       );
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_90,"bytes_.size ()","writer_.bytes_consumed ()",&local_98,&local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x39,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  local_c8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       (&(this->super_StringWriter).bytes_);
  local_d0 = pstore::serialize::archive::
             writer_base<pstore::serialize::archive::details::vector_writer_policy>::bytes_produced
                       (&(this->super_StringWriter).writer_.
                         super_writer_base<pstore::serialize::archive::details::vector_writer_policy>
                       );
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_c0,"bytes_.size ()","writer_.bytes_produced ()",&local_c8,&local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x3a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F (StringWriter, WriteCharString) {
    std::string const str{"hello"};
    pstore::serialize::write (writer_, str);

    EXPECT_THAT (bytes_,
                 ::testing::ElementsAre (std::uint8_t{0b1011}, std::uint8_t{0}, std::uint8_t{'h'},
                                         std::uint8_t{'e'}, std::uint8_t{'l'}, std::uint8_t{'l'},
                                         std::uint8_t{'o'}));
    EXPECT_EQ (bytes_.size (), writer_.bytes_consumed ());
    EXPECT_EQ (bytes_.size (), writer_.bytes_produced ());
}